

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<QtCbor::Element>::squeeze(QList<QtCbor::Element> *this)

{
  bool bVar1;
  qsizetype qVar2;
  QPodArrayOps<QtCbor::Element> *this_00;
  DataOps *pDVar3;
  QArrayDataPointer<QtCbor::Element> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  QArrayDataPointer<QtCbor::Element> *in_stack_ffffffffffffff98;
  QArrayDataPointer<QtCbor::Element> *in_stack_ffffffffffffffa0;
  Element *in_stack_ffffffffffffffa8;
  QFlagsStorage<QArrayData::ArrayOption> f;
  qsizetype in_stack_ffffffffffffffb0;
  qsizetype in_stack_ffffffffffffffb8;
  QArrayDataPointer<QtCbor::Element> *in_stack_ffffffffffffffc0;
  QArrayDataPointer<QtCbor::Element> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QArrayDataPointer<QtCbor::Element>::isMutable(in_RDI);
  if (!bVar1) goto LAB_0047db96;
  QArrayDataPointer<QtCbor::Element>::operator->(in_RDI);
  bVar1 = QArrayDataPointer<QtCbor::Element>::needsDetach(in_stack_ffffffffffffffa0);
  if (bVar1) {
LAB_0047da53:
    local_20.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_20.ptr = (Element *)&DAT_aaaaaaaaaaaaaaaa;
    local_20.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    size((QList<QtCbor::Element> *)in_RDI);
    QArrayDataPointer<QtCbor::Element>::QArrayDataPointer
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
               (AllocationOption)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
    qVar2 = size((QList<QtCbor::Element> *)in_RDI);
    if (qVar2 != 0) {
      bVar1 = QArrayDataPointer<QtCbor::Element>::needsDetach(in_stack_ffffffffffffffa0);
      if (bVar1) {
        this_00 = (QPodArrayOps<QtCbor::Element> *)
                  QArrayDataPointer<QtCbor::Element>::operator->(&local_20);
        QArrayDataPointer<QtCbor::Element>::data(in_RDI);
        QArrayDataPointer<QtCbor::Element>::data(in_RDI);
        QtPrivate::QPodArrayOps<QtCbor::Element>::copyAppend
                  (this_00,in_stack_ffffffffffffffa8,(Element *)in_stack_ffffffffffffffa0);
      }
      else {
        in_stack_ffffffffffffffa0 =
             (QArrayDataPointer<QtCbor::Element> *)
             QArrayDataPointer<QtCbor::Element>::operator->(&local_20);
        in_stack_ffffffffffffffa8 = QArrayDataPointer<QtCbor::Element>::data(in_RDI);
        QArrayDataPointer<QtCbor::Element>::data(in_RDI);
        QtPrivate::QPodArrayOps<QtCbor::Element>::moveAppend
                  ((QPodArrayOps<QtCbor::Element> *)in_stack_ffffffffffffffa0,
                   (Element *)in_stack_ffffffffffffff98,(Element *)0x47db51);
      }
    }
    QArrayDataPointer<QtCbor::Element>::swap(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    QArrayDataPointer<QtCbor::Element>::~QArrayDataPointer(in_stack_ffffffffffffffa0);
  }
  else {
    in_stack_ffffffffffffffc0 =
         (QArrayDataPointer<QtCbor::Element> *)size((QList<QtCbor::Element> *)in_RDI);
    qVar2 = capacity((QList<QtCbor::Element> *)0x47da42);
    if ((long)in_stack_ffffffffffffffc0 < qVar2) goto LAB_0047da53;
  }
  f.i = (Int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  pDVar3 = QArrayDataPointer<QtCbor::Element>::operator->(in_RDI);
  QFlags<QArrayData::ArrayOption>::QFlags
            ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffffa0,
             (ArrayOption)((ulong)pDVar3 >> 0x20));
  QArrayDataPointer<QtCbor::Element>::clearFlag(in_stack_ffffffffffffffa0,(ArrayOptions)f.i);
LAB_0047db96:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

inline void QList<T>::squeeze()
{
    if (!d.isMutable())
        return;
    if (d->needsDetach() || size() < capacity()) {
        // must allocate memory
        DataPointer detached(size());
        if (size()) {
            if (d.needsDetach())
                detached->copyAppend(d.data(), d.data() + d.size);
            else
                detached->moveAppend(d.data(), d.data() + d.size);
        }
        d.swap(detached);
    }
    // We're detached so this is fine
    d->clearFlag(Data::CapacityReserved);
}